

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::CaptureVertexSeparate
          (CaptureVertexSeparate *this,void **vtt,Context *context,char *test_name,
          char *test_description)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_CaptureVertexSeparate = pp_Var1;
  *(void **)((long)&this->_vptr_CaptureVertexSeparate + (long)pp_Var1[-3]) = vtt[1];
  this->m_buffers = (GLuint *)0x0;
  this->m_max_transform_feedback_separate_attribs = 0;
  *(undefined4 *)(&this->field_0x9c + (long)this->_vptr_CaptureVertexSeparate[-3]) = 0x8c8d;
  return;
}

Assistant:

gl3cts::TransformFeedback::CaptureVertexSeparate::CaptureVertexSeparate(deqp::Context& context, const char* test_name,
																		const char* test_description)
	: CaptureVertexInterleaved(context, test_name, test_description)
	, m_buffers(DE_NULL)
	, m_max_transform_feedback_separate_attribs(0)
{
	m_attrib_type = GL_SEPARATE_ATTRIBS;
}